

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O1

int evutil_gettime_monotonic_(evutil_monotonic_timer *base,timeval *tp)

{
  __suseconds_t _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_20;
  
  if (-1 < base->monotonic_clock) {
    iVar2 = clock_gettime(base->monotonic_clock,&local_20);
    if (iVar2 != -1) {
      tp->tv_sec = local_20.tv_sec;
      tp->tv_usec = local_20.tv_nsec / 1000;
      return 0;
    }
    return -1;
  }
  iVar2 = gettimeofday((timeval *)tp,(__timezone_ptr_t)0x0);
  if (iVar2 < 0) {
    return -1;
  }
  lVar3 = (base->adjust_monotonic_clock).tv_sec + tp->tv_sec;
  tp->tv_sec = lVar3;
  lVar4 = (base->adjust_monotonic_clock).tv_usec + tp->tv_usec;
  tp->tv_usec = lVar4;
  if (999999 < lVar4) {
    tp->tv_sec = lVar3 + 1;
    tp->tv_usec = lVar4 + -1000000;
  }
  lVar3 = (base->last_time).tv_sec;
  lVar4 = lVar3 - tp->tv_sec;
  if (lVar4 != 0) {
    if (lVar4 == 0 || lVar3 < tp->tv_sec) goto LAB_002de680;
  }
  else if ((base->last_time).tv_usec <= tp->tv_usec) goto LAB_002de680;
  lVar5 = (base->last_time).tv_usec - tp->tv_usec;
  lVar3 = lVar5 + 1000000;
  if (-1 < lVar5) {
    lVar3 = lVar5;
  }
  lVar4 = lVar4 + (base->adjust_monotonic_clock).tv_sec + (lVar5 >> 0x3f);
  (base->adjust_monotonic_clock).tv_sec = lVar4;
  lVar3 = lVar3 + (base->adjust_monotonic_clock).tv_usec;
  (base->adjust_monotonic_clock).tv_usec = lVar3;
  if (999999 < lVar3) {
    (base->adjust_monotonic_clock).tv_sec = lVar4 + 1;
    (base->adjust_monotonic_clock).tv_usec = lVar3 + -1000000;
  }
  _Var1 = (base->last_time).tv_usec;
  tp->tv_sec = (base->last_time).tv_sec;
  tp->tv_usec = _Var1;
LAB_002de680:
  _Var1 = tp->tv_usec;
  (base->last_time).tv_sec = tp->tv_sec;
  (base->last_time).tv_usec = _Var1;
  return 0;
}

Assistant:

int
evutil_gettime_monotonic_(struct evutil_monotonic_timer *base,
    struct timeval *tp)
{
	struct timespec ts;

	if (base->monotonic_clock < 0) {
		if (evutil_gettimeofday(tp, NULL) < 0)
			return -1;
		adjust_monotonic_time(base, tp);
		return 0;
	}

	if (clock_gettime(base->monotonic_clock, &ts) == -1)
		return -1;
	tp->tv_sec = ts.tv_sec;
	tp->tv_usec = ts.tv_nsec / 1000;

	return 0;
}